

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  ulong uVar1;
  _Head_base<0UL,_fmt::v5::locale_provider_*,_false> _Var2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  num_writer f;
  undefined1 uVar6;
  numpunct *pnVar7;
  uint uVar8;
  string_view prefix;
  locale loc;
  locale local_58 [8];
  ulong local_50;
  unsigned_type local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  locale local_38 [8];
  
  uVar1 = this->abs_value;
  lVar5 = 0x3f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar8 = ((uint)lVar5 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  local_50 = *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 + (ulong)uVar8 * 8);
  _Var2._M_head_impl =
       (this->writer->locale_)._M_t.
       super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
       ._M_t.
       super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
       .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (locale_provider *)0x0) {
    std::locale::locale(local_58);
  }
  else {
    (*(_Var2._M_head_impl)->_vptr_locale_provider[2])(local_38,_Var2._M_head_impl);
    std::locale::locale(local_58,local_38);
    std::locale::~locale(local_38);
  }
  pnVar7 = std::use_facet<std::__cxx11::numpunct<char>>(local_58);
  uVar6 = (**(code **)(*(long *)pnVar7 + 0x18))(pnVar7);
  bVar3 = local_50 <= uVar1;
  bVar4 = uVar1 < local_50;
  std::locale::~locale(local_58);
  uStack_40 = bVar3 + uVar8 + (uVar8 - bVar4) / 3;
  local_48 = this->abs_value;
  uStack_3c = CONCAT31(uStack_3c._1_3_,uVar6);
  f._12_4_ = uStack_3c;
  f.size = uStack_40;
  f.abs_value = local_48;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              *)this->writer,uStack_40,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      unsigned num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_.get());
      unsigned size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }